

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  __sighandler_t p_Var4;
  int *piVar5;
  pthread_t __th;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int fd;
  char *pcVar9;
  cpu_set_t cpuset;
  sigset_t signewset;
  int local_13c;
  cpu_set_t local_138;
  sigset_t local_b0;
  
  pcVar9 = (char *)(ulong)(uint)error_fd;
  iVar7 = 1;
  do {
    if (((iVar7 != 9) && (iVar7 != 0x13)) &&
       (p_Var4 = signal(iVar7,(__sighandler_t)0x0), p_Var4 == (__sighandler_t)0xffffffffffffffff))
    goto LAB_007dcd45;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x20);
  if ((options->flags & 8) != 0) {
    setsid();
  }
  local_13c = error_fd;
  if (0 < stdio_count) {
    pcVar9 = (char *)0x0;
    do {
      if ((char *)(ulong)(uint)pipes[(long)pcVar9][1] < pcVar9) {
        iVar7 = fcntl(pipes[(long)pcVar9][1],0x406,(char *)(ulong)(uint)stdio_count);
        pipes[(long)pcVar9][1] = iVar7;
        if (iVar7 == -1) goto LAB_007dcd56;
      }
      pcVar9 = pcVar9 + 1;
    } while ((char *)(ulong)(uint)stdio_count != pcVar9);
    if (0 < stdio_count) {
      pcVar9 = "/dev/null";
      iVar7 = 0;
      do {
        iVar2 = pipes[iVar7][1];
        if (iVar2 < 0) {
          if (iVar7 < 3) {
            uv__close_nocheckstdio(iVar7);
            iVar2 = open("/dev/null",(uint)(iVar7 != 0) * 2);
            if (iVar2 < 0) goto LAB_007dcd56;
            iVar8 = iVar2;
            fd = iVar7;
            if (iVar7 != iVar2) goto LAB_007dcc41;
            goto LAB_007dcc6f;
          }
        }
        else {
          iVar8 = -1;
          if (iVar7 == iVar2) {
            iVar2 = uv__cloexec(iVar7,0);
            iVar8 = -1;
            if (iVar2 != 0) goto LAB_007dce29;
          }
          else {
LAB_007dcc41:
            iVar7 = dup2(iVar2,iVar7);
            if (iVar7 == -1) goto LAB_007dcd56;
          }
          fd = iVar8;
          if ((iVar7 < 3) && (iVar8 == -1)) {
            uv__nonblock_fcntl(iVar7,0);
            fd = -1;
          }
LAB_007dcc6f:
          if (stdio_count <= fd) {
            uv__close(fd);
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < stdio_count);
    }
  }
  if ((options->cwd != (char *)0x0) && (iVar7 = chdir(options->cwd), iVar7 != 0)) goto LAB_007dcd56;
  uVar3 = options->flags;
  pcVar9 = (char *)(ulong)(uint)error_fd;
  if ((uVar3 & 3) != 0) {
    piVar5 = __errno_location();
    iVar7 = *piVar5;
    setgroups(0,(__gid_t *)0x0);
    *piVar5 = iVar7;
    uVar3 = options->flags;
  }
  if ((uVar3 & 2) != 0) {
    iVar7 = setgid(options->gid);
    if (iVar7 != 0) goto LAB_007dcd45;
    uVar3 = options->flags;
  }
  if (((uVar3 & 1) != 0) && (iVar7 = setuid(options->uid), iVar7 != 0)) goto LAB_007dcd45;
  if (options->cpumask != (char *)0x0) goto LAB_007dcd68;
  do {
    if (options->env != (char **)0x0) {
      _environ = options->env;
    }
    sigemptyset(&local_b0);
    iVar7 = sigprocmask(2,&local_b0,(sigset_t *)0x0);
    if (iVar7 != 0) {
      abort();
    }
    execvp(options->file,options->args);
    piVar5 = __errno_location();
    uv__write_int((int)pcVar9,-*piVar5);
LAB_007dcd45:
    piVar5 = __errno_location();
    uv__write_int((int)pcVar9,-*piVar5);
LAB_007dcd56:
    piVar5 = __errno_location();
    uv__write_int(local_13c,-*piVar5);
LAB_007dcd68:
    uVar3 = uv_cpumask_size();
    if (options->cpumask_size < (ulong)(long)(int)uVar3) {
      __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                    ,400,
                    "void uv__process_child_init(const uv_process_options_t *, int, int (*)[2], int)"
                   );
    }
    local_138.__bits[0xe] = 0;
    local_138.__bits[0xf] = 0;
    local_138.__bits[0xc] = 0;
    local_138.__bits[0xd] = 0;
    local_138.__bits[10] = 0;
    local_138.__bits[0xb] = 0;
    local_138.__bits[8] = 0;
    local_138.__bits[9] = 0;
    local_138.__bits[6] = 0;
    local_138.__bits[7] = 0;
    local_138.__bits[4] = 0;
    local_138.__bits[5] = 0;
    local_138.__bits[2] = 0;
    local_138.__bits[3] = 0;
    local_138.__bits[0] = 0;
    local_138.__bits[1] = 0;
    if (0 < (int)uVar3) {
      pcVar1 = options->cpumask;
      uVar6 = 0;
      do {
        if ((uVar6 < 0x400) && (pcVar1[uVar6] != '\0')) {
          local_138.__bits[uVar6 >> 6] = local_138.__bits[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    __th = pthread_self();
    iVar2 = pthread_setaffinity_np(__th,0x80,&local_138);
  } while (iVar2 == 0);
  iVar2 = -iVar2;
  error_fd = (int)pcVar9;
LAB_007dce29:
  uv__write_int(error_fd,iVar2);
  return;
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  int r;
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif
#endif

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

    r = -pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (r != 0) {
      uv__write_int(error_fd, r);
      _exit(127);
    }
  }
#endif
#endif

  if (options->env != NULL)
    environ = options->env;

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}